

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O1

void __thiscall Imf_3_2::SampleCountChannel::resize(SampleCountChannel *this)

{
  ulong uVar1;
  ImageLevel *pIVar2;
  size_t sVar3;
  uint *__s;
  uint *__s_00;
  size_t *__s_01;
  ulong uVar4;
  
  ImageChannel::resize(&this->super_ImageChannel);
  if (this->_numSamples != (uint *)0x0) {
    operator_delete__(this->_numSamples);
  }
  if (this->_sampleListSizes != (uint *)0x0) {
    operator_delete__(this->_sampleListSizes);
  }
  if (this->_sampleListPositions != (size_t *)0x0) {
    operator_delete__(this->_sampleListPositions);
  }
  this->_numSamples = (uint *)0x0;
  this->_sampleListSizes = (uint *)0x0;
  this->_sampleListPositions = (size_t *)0x0;
  uVar1 = (this->super_ImageChannel)._numPixels;
  uVar4 = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  __s = (uint *)operator_new__(uVar4);
  this->_numSamples = __s;
  __s_00 = (uint *)operator_new__(uVar4);
  this->_sampleListSizes = __s_00;
  __s_01 = (size_t *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
  this->_sampleListPositions = __s_01;
  pIVar2 = (this->super_ImageChannel)._level;
  sVar3 = (this->super_ImageChannel)._numPixels;
  this->_base = __s + (-((long)(this->super_ImageChannel)._pixelsPerRow *
                        (long)(pIVar2->_dataWindow).min.y) - (long)(pIVar2->_dataWindow).min.x);
  if (sVar3 != 0) {
    memset(__s,0,sVar3 * 4);
    memset(__s_00,0,sVar3 * 4);
    memset(__s_01,0,sVar3 << 3);
  }
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  this->_sampleBufferSize = 0;
  return;
}

Assistant:

void
SampleCountChannel::resize ()
{
    ImageChannel::resize ();

    delete[] _numSamples;
    delete[] _sampleListSizes;
    delete[] _sampleListPositions;

    _numSamples          = 0; // set to 0 to prevent double
    _sampleListSizes     = 0; // deletion in case of an exception
    _sampleListPositions = 0;

    _numSamples          = new unsigned int[numPixels ()];
    _sampleListSizes     = new unsigned int[numPixels ()];
    _sampleListPositions = new size_t[numPixels ()];

    resetBasePointer ();

    for (size_t i = 0; i < numPixels (); ++i)
    {
        _numSamples[i]          = 0;
        _sampleListSizes[i]     = 0;
        _sampleListPositions[i] = 0;
    }

    _totalNumSamples      = 0;
    _totalSamplesOccupied = 0;

    _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);
}